

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::ParseRegexp(int iters,string *regexp)

{
  ostream *poVar1;
  LogMessage local_1b8;
  StringPiece local_38;
  Regexp *local_28;
  Regexp *re;
  string *psStack_18;
  int i;
  string *regexp_local;
  int iters_local;
  
  psStack_18 = regexp;
  regexp_local._4_4_ = iters;
  for (re._4_4_ = 0; re._4_4_ < regexp_local._4_4_; re._4_4_ = re._4_4_ + 1) {
    StringPiece::StringPiece(&local_38,psStack_18);
    local_28 = Regexp::Parse(&local_38,LikePerl,(RegexpStatus *)0x0);
    if (local_28 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x284);
      poVar1 = LogMessage::stream(&local_1b8);
      std::operator<<(poVar1,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    }
    Regexp::Decref(local_28);
  }
  return;
}

Assistant:

void ParseRegexp(int iters, const string& regexp) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    re->Decref();
  }
}